

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::writeSequentialContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  ulong i;
  long lVar1;
  int *piVar2;
  QDataStream *this;
  qint32 i_00;
  long lVar3;
  
  i = (c->d).size;
  if (i >> 1 < 0x7fffffff) {
    i_00 = (qint32)i;
  }
  else {
    if (0x15 < s->ver) {
      this = QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,i);
      goto LAB_0038bcb4;
    }
    if (i != 0xfffffffe) {
      QDataStream::setStatus(s,SizeLimitExceeded);
      return s;
    }
    i_00 = -2;
  }
  QDataStream::operator<<(s,i_00);
LAB_0038bcb4:
  lVar1 = (c->d).size;
  if (lVar1 != 0) {
    piVar2 = (c->d).ptr;
    lVar3 = 0;
    do {
      QDataStream::operator<<(s,*(qint32 *)((long)piVar2 + lVar3));
      lVar3 = lVar3 + 4;
    } while (lVar1 << 2 != lVar3);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}